

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::StringTree::
concat<kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::___char_const>_kj__String_kj__ArrayPtr<char_const>_kj__CappedArray<char,14ul>_kj__ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,undefined8 *params,long params_1,
          long params_2,long params_3,long params_4,long params_5,long params_6,long params_7,
          undefined8 *params_8,long params_9,undefined8 *params_10,long params_11,long params_12,
          long params_13,long params_14,long params_15,long params_16,long params_17,
          undefined8 *params_18,long params_19,undefined8 *params_20,long params_21,long params_22,
          long params_23,long params_24,long params_25,long params_26,long params_27,long params_28,
          long params_29,long params_30,long params_31,undefined8 *params_32,long params_33,
          undefined8 *params_34,long params_35,long params_36,long params_37,long params_38,
          long params_39,long params_40,long params_41,long params_42,long params_43,long params_44,
          long params_45,undefined8 *params_46,long params_47,undefined8 *params_48,
          undefined8 *params_49,long params_50,long params_51,long params_52,long params_53,
          long params_54,long params_55,long params_56,long params_57,long params_58,long params_59,
          long params_60,undefined8 *params_61,long params_62,undefined8 *params_63,long params_64,
          long params_65)

{
  long lVar1;
  size_t sVar2;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  char *pcVar3;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  long in_stack_000001f8;
  long in_stack_00000200;
  long in_stack_00000208;
  long in_stack_00000210;
  long in_stack_00000218;
  long in_stack_00000220;
  long in_stack_00000228;
  long in_stack_00000230;
  long in_stack_00000238;
  undefined8 *in_stack_00000240;
  long in_stack_00000248;
  undefined8 *in_stack_00000250;
  long in_stack_00000258;
  long in_stack_00000260;
  long in_stack_00000268;
  long in_stack_00000270;
  long in_stack_00000278;
  long in_stack_00000280;
  long in_stack_00000288;
  long in_stack_00000290;
  long in_stack_00000298;
  long in_stack_000002a0;
  long in_stack_000002a8;
  undefined8 *in_stack_000002b0;
  long in_stack_000002b8;
  undefined8 *in_stack_000002c0;
  long in_stack_000002c8;
  long in_stack_000002d0;
  long in_stack_000002d8;
  long in_stack_000002e0;
  long in_stack_000002e8;
  long in_stack_000002f0;
  long in_stack_000002f8;
  long in_stack_00000300;
  long in_stack_00000308;
  long in_stack_00000310;
  long in_stack_00000318;
  undefined8 *in_stack_00000320;
  long in_stack_00000328;
  Array<kj::StringTree::Branch> local_3b0;
  StringTree *local_398;
  undefined8 *local_390;
  size_t local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 local_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  long local_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  long local_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 local_270;
  undefined8 local_268;
  long local_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  long local_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  long local_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  long local_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  long local_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  long local_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  long local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  long local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  long local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  long local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  local_388 = this->size_;
  uStack_380 = *params;
  local_378 = *(undefined8 *)(params_1 + 8);
  uStack_370 = *(undefined8 *)(params_2 + 8);
  local_368 = *(undefined8 *)(params_3 + 8);
  uStack_360 = *(undefined8 *)(params_4 + 8);
  local_358 = *(undefined8 *)(params_5 + 8);
  uStack_350 = *(undefined8 *)(params_6 + 8);
  local_348 = *(undefined8 *)(params_7 + 8);
  uStack_340 = *params_8;
  local_338 = *(undefined8 *)(params_9 + 8);
  local_330 = *params_10;
  local_328 = *(undefined8 *)(params_11 + 8);
  uStack_320 = *(undefined8 *)(params_12 + 8);
  local_318 = *(undefined8 *)(params_13 + 8);
  uStack_310 = *(undefined8 *)(params_14 + 8);
  local_308 = *(undefined8 *)(params_15 + 8);
  uStack_300 = *(undefined8 *)(params_16 + 8);
  local_2f8 = *(undefined8 *)(params_17 + 8);
  uStack_2f0 = *params_18;
  local_2e8 = *(undefined8 *)(params_19 + 8);
  local_2e0 = *params_20;
  local_2d8 = *(undefined8 *)(params_21 + 8);
  lVar1 = 0;
  local_2d0 = *(long *)(params_22 + 8) + -1;
  if (*(long *)(params_22 + 8) == 0) {
    local_2d0 = lVar1;
  }
  local_2c8 = *(undefined8 *)(params_23 + 8);
  uStack_2c0 = *(undefined8 *)(params_24 + 8);
  local_2b8 = *(undefined8 *)(params_25 + 8);
  uStack_2b0 = *(undefined8 *)(params_26 + 8);
  local_2a8 = *(undefined8 *)(params_27 + 8);
  uStack_2a0 = *(undefined8 *)(params_28 + 8);
  local_298 = *(undefined8 *)(params_29 + 8);
  local_290 = *(long *)(params_30 + 8) + -1;
  if (*(long *)(params_30 + 8) == 0) {
    local_290 = lVar1;
  }
  local_288 = *(undefined8 *)(params_31 + 8);
  uStack_280 = *params_32;
  local_278 = *(undefined8 *)(params_33 + 8);
  local_270 = *params_34;
  local_268 = *(undefined8 *)(params_35 + 8);
  local_260 = *(long *)(params_36 + 8) + -1;
  if (*(long *)(params_36 + 8) == 0) {
    local_260 = lVar1;
  }
  local_258 = *(undefined8 *)(params_37 + 8);
  uStack_250 = *(undefined8 *)(params_38 + 8);
  local_248 = *(undefined8 *)(params_39 + 8);
  uStack_240 = *(undefined8 *)(params_40 + 8);
  local_238 = *(undefined8 *)(params_41 + 8);
  uStack_230 = *(undefined8 *)(params_42 + 8);
  local_228 = *(undefined8 *)(params_43 + 8);
  local_220 = *(long *)(params_44 + 8) + -1;
  if (*(long *)(params_44 + 8) == 0) {
    local_220 = lVar1;
  }
  local_218 = *(undefined8 *)(params_45 + 8);
  uStack_210 = *params_46;
  local_208 = *(undefined8 *)(params_47 + 8);
  local_200 = *params_48;
  uStack_1f8 = *params_49;
  local_1f0 = *(undefined8 *)(params_50 + 8);
  uStack_1e8 = *(undefined8 *)(params_51 + 8);
  local_1e0 = *(undefined8 *)(params_52 + 8);
  uStack_1d8 = *(undefined8 *)(params_53 + 8);
  local_1d0 = *(undefined8 *)(params_54 + 8);
  local_1c8 = *(long *)(params_55 + 8) + -1;
  if (*(long *)(params_55 + 8) == 0) {
    local_1c8 = lVar1;
  }
  local_1c0 = *(undefined8 *)(params_56 + 8);
  uStack_1b8 = *(undefined8 *)(params_57 + 8);
  local_1b0 = *(undefined8 *)(params_58 + 8);
  local_1a8 = *(long *)(params_59 + 8) + -1;
  if (*(long *)(params_59 + 8) == 0) {
    local_1a8 = lVar1;
  }
  local_1a0 = *(undefined8 *)(params_60 + 8);
  uStack_198 = *params_61;
  local_190 = *(undefined8 *)(params_62 + 8);
  local_188 = *params_63;
  local_180 = *(undefined8 *)(params_64 + 8);
  uStack_178 = *(undefined8 *)(params_65 + 8);
  local_170 = *(undefined8 *)(in_stack_000001f8 + 8);
  uStack_168 = *(undefined8 *)(in_stack_00000200 + 8);
  local_160 = *(undefined8 *)(in_stack_00000208 + 8);
  local_158 = *(long *)(in_stack_00000210 + 8) + -1;
  if (*(long *)(in_stack_00000210 + 8) == 0) {
    local_158 = lVar1;
  }
  local_150 = *(undefined8 *)(in_stack_00000218 + 8);
  uStack_148 = *(undefined8 *)(in_stack_00000220 + 8);
  local_140 = *(undefined8 *)(in_stack_00000228 + 8);
  local_138 = *(long *)(in_stack_00000230 + 8) + -1;
  if (*(long *)(in_stack_00000230 + 8) == 0) {
    local_138 = lVar1;
  }
  local_130 = *(undefined8 *)(in_stack_00000238 + 8);
  uStack_128 = *in_stack_00000240;
  local_120 = *(undefined8 *)(in_stack_00000248 + 8);
  local_118 = *in_stack_00000250;
  local_110 = *(undefined8 *)(in_stack_00000258 + 8);
  uStack_108 = *(undefined8 *)(in_stack_00000260 + 8);
  local_100 = *(undefined8 *)(in_stack_00000268 + 8);
  uStack_f8 = *(undefined8 *)(in_stack_00000270 + 8);
  local_f0 = *(undefined8 *)(in_stack_00000278 + 8);
  local_e8 = *(long *)(in_stack_00000280 + 8) + -1;
  if (*(long *)(in_stack_00000280 + 8) == 0) {
    local_e8 = lVar1;
  }
  local_e0 = *(undefined8 *)(in_stack_00000288 + 8);
  uStack_d8 = *(undefined8 *)(in_stack_00000290 + 8);
  local_d0 = *(undefined8 *)(in_stack_00000298 + 8);
  local_c8 = *(long *)(in_stack_000002a0 + 8) + -1;
  if (*(long *)(in_stack_000002a0 + 8) == 0) {
    local_c8 = lVar1;
  }
  local_c0 = *(undefined8 *)(in_stack_000002a8 + 8);
  uStack_b8 = *in_stack_000002b0;
  local_b0 = *(undefined8 *)(in_stack_000002b8 + 8);
  local_a8 = *in_stack_000002c0;
  local_a0 = *(undefined8 *)(in_stack_000002c8 + 8);
  local_98 = *(long *)(in_stack_000002d0 + 8) + -1;
  if (*(long *)(in_stack_000002d0 + 8) == 0) {
    local_98 = lVar1;
  }
  local_90 = *(undefined8 *)(in_stack_000002d8 + 8);
  uStack_88 = *(undefined8 *)(in_stack_000002e0 + 8);
  local_80 = *(undefined8 *)(in_stack_000002e8 + 8);
  uStack_78 = *(undefined8 *)(in_stack_000002f0 + 8);
  local_70 = *(undefined8 *)(in_stack_000002f8 + 8);
  uStack_68 = *(undefined8 *)(in_stack_00000300 + 8);
  local_60 = *(undefined8 *)(in_stack_00000308 + 8);
  local_58 = *(long *)(in_stack_00000310 + 8) + -1;
  if (*(long *)(in_stack_00000310 + 8) == 0) {
    local_58 = lVar1;
  }
  local_50 = *(undefined8 *)(in_stack_00000318 + 8);
  uStack_48 = *in_stack_00000320;
  local_40 = *(undefined8 *)(in_stack_00000328 + 8);
  nums._M_len = (size_type)params;
  nums._M_array = (iterator)0x6a;
  local_398 = this;
  local_390 = params;
  sVar2 = _::sum((_ *)&local_388,nums);
  __return_storage_ptr__->size_ = sVar2;
  local_388 = 0;
  uStack_380 = 0;
  local_378 = *(undefined8 *)(params_1 + 8);
  uStack_370 = *(undefined8 *)(params_2 + 8);
  local_368 = *(undefined8 *)(params_3 + 8);
  uStack_360 = *(undefined8 *)(params_4 + 8);
  local_358 = *(undefined8 *)(params_5 + 8);
  uStack_350 = *(undefined8 *)(params_6 + 8);
  local_348 = *(undefined8 *)(params_7 + 8);
  uStack_340 = *params_8;
  local_338 = *(undefined8 *)(params_9 + 8);
  local_330 = 0;
  local_328 = *(undefined8 *)(params_11 + 8);
  uStack_320 = *(undefined8 *)(params_12 + 8);
  local_318 = *(undefined8 *)(params_13 + 8);
  uStack_310 = *(undefined8 *)(params_14 + 8);
  local_308 = *(undefined8 *)(params_15 + 8);
  uStack_300 = *(undefined8 *)(params_16 + 8);
  local_2f8 = *(undefined8 *)(params_17 + 8);
  uStack_2f0 = *params_18;
  local_2e8 = *(undefined8 *)(params_19 + 8);
  local_2e0 = 0;
  local_2d8 = *(undefined8 *)(params_21 + 8);
  local_2d0 = 0;
  local_2c8 = *(undefined8 *)(params_23 + 8);
  uStack_2c0 = *(undefined8 *)(params_24 + 8);
  local_2b8 = *(undefined8 *)(params_25 + 8);
  uStack_2b0 = *(undefined8 *)(params_26 + 8);
  local_2a8 = *(undefined8 *)(params_27 + 8);
  uStack_2a0 = *(undefined8 *)(params_28 + 8);
  local_298 = *(undefined8 *)(params_29 + 8);
  local_290 = 0;
  local_288 = *(undefined8 *)(params_31 + 8);
  uStack_280 = *params_32;
  local_278 = *(undefined8 *)(params_33 + 8);
  local_270 = 0;
  local_268 = *(undefined8 *)(params_35 + 8);
  local_260 = 0;
  local_258 = *(undefined8 *)(params_37 + 8);
  uStack_250 = *(undefined8 *)(params_38 + 8);
  local_248 = *(undefined8 *)(params_39 + 8);
  uStack_240 = *(undefined8 *)(params_40 + 8);
  local_238 = *(undefined8 *)(params_41 + 8);
  uStack_230 = *(undefined8 *)(params_42 + 8);
  local_228 = *(undefined8 *)(params_43 + 8);
  local_220 = 0;
  local_218 = *(undefined8 *)(params_45 + 8);
  uStack_210 = *params_46;
  local_208 = *(undefined8 *)(params_47 + 8);
  local_200 = 0;
  uStack_1f8 = 0;
  local_1f0 = *(undefined8 *)(params_50 + 8);
  uStack_1e8 = *(undefined8 *)(params_51 + 8);
  local_1e0 = *(undefined8 *)(params_52 + 8);
  uStack_1d8 = *(undefined8 *)(params_53 + 8);
  local_1d0 = *(undefined8 *)(params_54 + 8);
  local_1c8 = 0;
  local_1c0 = *(undefined8 *)(params_56 + 8);
  uStack_1b8 = *(undefined8 *)(params_57 + 8);
  local_1b0 = *(undefined8 *)(params_58 + 8);
  local_1a8 = 0;
  local_1a0 = *(undefined8 *)(params_60 + 8);
  uStack_198 = *params_61;
  local_190 = *(undefined8 *)(params_62 + 8);
  local_188 = 0;
  local_180 = *(undefined8 *)(params_64 + 8);
  uStack_178 = *(undefined8 *)(params_65 + 8);
  local_170 = *(undefined8 *)(in_stack_000001f8 + 8);
  uStack_168 = *(undefined8 *)(in_stack_00000200 + 8);
  local_160 = *(undefined8 *)(in_stack_00000208 + 8);
  local_158 = 0;
  local_150 = *(undefined8 *)(in_stack_00000218 + 8);
  uStack_148 = *(undefined8 *)(in_stack_00000220 + 8);
  local_140 = *(undefined8 *)(in_stack_00000228 + 8);
  local_138 = 0;
  local_130 = *(undefined8 *)(in_stack_00000238 + 8);
  uStack_128 = *in_stack_00000240;
  local_120 = *(undefined8 *)(in_stack_00000248 + 8);
  local_118 = 0;
  local_110 = *(undefined8 *)(in_stack_00000258 + 8);
  uStack_108 = *(undefined8 *)(in_stack_00000260 + 8);
  local_100 = *(undefined8 *)(in_stack_00000268 + 8);
  uStack_f8 = *(undefined8 *)(in_stack_00000270 + 8);
  local_f0 = *(undefined8 *)(in_stack_00000278 + 8);
  local_e8 = 0;
  local_e0 = *(undefined8 *)(in_stack_00000288 + 8);
  uStack_d8 = *(undefined8 *)(in_stack_00000290 + 8);
  local_d0 = *(undefined8 *)(in_stack_00000298 + 8);
  local_c8 = 0;
  local_c0 = *(undefined8 *)(in_stack_000002a8 + 8);
  uStack_b8 = *in_stack_000002b0;
  local_b0 = *(undefined8 *)(in_stack_000002b8 + 8);
  local_a8 = 0;
  local_a0 = *(undefined8 *)(in_stack_000002c8 + 8);
  local_98 = 0;
  local_90 = *(undefined8 *)(in_stack_000002d8 + 8);
  uStack_88 = *(undefined8 *)(in_stack_000002e0 + 8);
  local_80 = *(undefined8 *)(in_stack_000002e8 + 8);
  uStack_78 = *(undefined8 *)(in_stack_000002f0 + 8);
  local_70 = *(undefined8 *)(in_stack_000002f8 + 8);
  uStack_68 = *(undefined8 *)(in_stack_00000300 + 8);
  local_60 = *(undefined8 *)(in_stack_00000308 + 8);
  local_58 = 0;
  local_50 = *(undefined8 *)(in_stack_00000318 + 8);
  uStack_48 = *in_stack_00000320;
  local_40 = *(undefined8 *)(in_stack_00000328 + 8);
  nums_00._M_len = extraout_RDX;
  nums_00._M_array = (iterator)0x6a;
  sVar2 = _::sum((_ *)&local_388,nums_00);
  heapString((String *)&local_3b0,sVar2);
  Array<char>::operator=(&(__return_storage_ptr__->text).content,(Array<char> *)&local_3b0);
  Array<char>::~Array((Array<char> *)&local_3b0);
  local_388 = 1;
  uStack_380 = 1;
  local_378 = 0;
  uStack_370 = 0;
  local_368 = 0;
  uStack_360 = 0;
  local_358 = 0;
  uStack_350 = 0;
  local_348 = 0;
  uStack_340 = 0;
  local_338 = 0;
  local_330 = 1;
  local_328 = 0;
  uStack_320 = 0;
  local_318 = 0;
  uStack_310 = 0;
  local_308 = 0;
  uStack_300 = 0;
  local_2f8 = 0;
  uStack_2f0 = 0;
  local_2e8 = 0;
  local_2e0 = 1;
  local_2d8 = 0;
  local_2d0 = 1;
  local_2c8 = 0;
  uStack_2c0 = 0;
  local_298 = 0;
  local_2b8 = 0;
  uStack_2b0 = 0;
  local_2a8 = 0;
  uStack_2a0 = 0;
  local_290 = 1;
  local_288 = 0;
  uStack_280 = 0;
  local_278 = 0;
  local_270 = 1;
  local_268 = 0;
  local_260 = 1;
  local_258 = 0;
  uStack_250 = 0;
  local_228 = 0;
  local_248 = 0;
  uStack_240 = 0;
  local_238 = 0;
  uStack_230 = 0;
  local_220 = 1;
  local_218 = 0;
  uStack_210 = 0;
  local_208 = 0;
  local_200 = 1;
  uStack_1f8 = 1;
  local_1d0 = 0;
  local_1f0 = 0;
  uStack_1e8 = 0;
  local_1e0 = 0;
  uStack_1d8 = 0;
  local_1c8 = 1;
  local_1c0 = 0;
  uStack_1b8 = 0;
  local_1b0 = 0;
  local_1a8 = 1;
  local_1a0 = 0;
  uStack_198 = 0;
  local_190 = 0;
  local_188 = 1;
  local_160 = 0;
  local_170 = 0;
  uStack_168 = 0;
  local_180 = 0;
  uStack_178 = 0;
  local_158 = 1;
  local_150 = 0;
  uStack_148 = 0;
  local_140 = 0;
  local_138 = 1;
  local_130 = 0;
  uStack_128 = 0;
  local_120 = 0;
  local_118 = 1;
  local_f0 = 0;
  local_100 = 0;
  uStack_f8 = 0;
  local_110 = 0;
  uStack_108 = 0;
  local_e8 = 1;
  local_e0 = 0;
  uStack_d8 = 0;
  local_d0 = 0;
  local_c8 = 1;
  local_c0 = 0;
  uStack_b8 = 0;
  local_b0 = 0;
  local_a8 = 1;
  local_a0 = 0;
  local_98 = 1;
  local_70 = 0;
  uStack_68 = 0;
  local_80 = 0;
  uStack_78 = 0;
  local_90 = 0;
  uStack_88 = 0;
  local_60 = 0;
  local_58 = 1;
  local_50 = 0;
  uStack_48 = 0;
  local_40 = 0;
  nums_01._M_len = extraout_RDX_00;
  nums_01._M_array = (iterator)0x6a;
  sVar2 = _::sum((_ *)&local_388,nums_01);
  local_3b0.ptr = _::HeapArrayDisposer::allocate<kj::StringTree::Branch>(sVar2);
  local_3b0.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_3b0.size_ = sVar2;
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_3b0);
  Array<kj::StringTree::Branch>::~Array(&local_3b0);
  pcVar3 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar3 != (char *)0x0) {
    pcVar3 = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_con___char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pcVar3,0,local_398,local_390,params_1,params_2,params_3,params_4
             ,params_5,params_6,params_7,params_8,params_9,params_10,params_11,params_12,params_13,
             params_14,params_15,params_16,params_17,params_18,params_19,params_20,params_21,
             params_22,params_23,params_24,params_25,params_26,params_27,params_28,params_29,
             params_30,params_31,params_32,params_33,params_34,params_35,params_36,params_37,
             params_38,params_39,params_40,params_41,params_42,params_43,params_44,params_45,
             params_46,params_47,params_48,params_49,params_50,params_51,params_52,params_53,
             params_54,params_55,params_56,params_57,params_58,params_59,params_60,params_61,
             params_62,params_63);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}